

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::paintEvent(QToolBar *this,QPaintEvent *param_2)

{
  bool bVar1;
  QToolBarPrivate *pQVar2;
  QStyle *pQVar3;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QStyle *style;
  QToolBarPrivate *d;
  QPainter p;
  QStyleOptionToolBar opt;
  QWidget *in_stack_ffffffffffffff58;
  QBrush *pQVar4;
  undefined1 *local_68;
  undefined1 local_60 [16];
  QBrush local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QToolBar *)0x6ed225);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_68,&in_RDI->super_QPaintDevice);
  pQVar3 = QWidget::style(in_stack_ffffffffffffff58);
  memset(local_60,0xaa,0x58);
  QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6ed276);
  (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,local_60);
  if (((((pQVar2->layout->super_QLayout).super_QLayoutItem.field_0xc & 1) != 0) ||
      (((pQVar2->layout->super_QLayout).super_QLayoutItem.field_0xd & 1) != 0)) ||
     (bVar1 = QWidget::isWindow(in_RDI), bVar1)) {
    pQVar4 = local_50;
    QWidget::palette(in_RDI);
    QPalette::window((QPalette *)0x6ed2dc);
    QPainter::fillRect((QRect *)&local_68,pQVar4);
    (**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,0x28,local_60,&local_68,in_RDI);
    (**(code **)(*(long *)pQVar3 + 0xb0))(pQVar3,6,local_60,&local_68,in_RDI);
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,0x28,local_60,&local_68,in_RDI);
  }
  local_50._0_16_ = (**(code **)(*(long *)pQVar3 + 0xc0))(pQVar3,0x34,local_60,in_RDI);
  bVar1 = QRect::isValid((QRect *)in_RDI);
  if (bVar1) {
    (**(code **)(*(long *)pQVar3 + 0xb0))(pQVar3,0x24,local_60,&local_68,in_RDI);
  }
  QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6ed3d0);
  QPainter::~QPainter((QPainter *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBar::paintEvent(QPaintEvent *)
{
    Q_D(QToolBar);

    QPainter p(this);
    QStyle *style = this->style();
    QStyleOptionToolBar opt;
    initStyleOption(&opt);

    if (d->layout->expanded || d->layout->animating || isWindow()) {
        //if the toolbar is expended, we need to fill the background with the window color
        //because some styles may expects that.
        p.fillRect(opt.rect, palette().window());
        style->drawControl(QStyle::CE_ToolBar, &opt, &p, this);
        style->drawPrimitive(QStyle::PE_FrameMenu, &opt, &p, this);
    } else {
        style->drawControl(QStyle::CE_ToolBar, &opt, &p, this);
    }

    opt.rect = style->subElementRect(QStyle::SE_ToolBarHandle, &opt, this);
    if (opt.rect.isValid())
        style->drawPrimitive(QStyle::PE_IndicatorToolBarHandle, &opt, &p, this);
}